

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O1

void __thiscall Assimp::X3DImporter::ParseHelper_Group_Begin(X3DImporter *this,bool pStatic)

{
  size_t *psVar1;
  CX3DImporter_NodeElement *pCVar2;
  CX3DImporter_NodeElement *pCVar3;
  _List_node_base *p_Var4;
  
  pCVar3 = (CX3DImporter_NodeElement *)operator_new(0x98);
  pCVar2 = this->NodeElement_Cur;
  pCVar3->Type = 0;
  (pCVar3->ID)._M_dataplus._M_p = (pointer)&(pCVar3->ID).field_2;
  (pCVar3->ID)._M_string_length = 0;
  (pCVar3->ID).field_2._M_local_buf[0] = '\0';
  pCVar3->Parent = pCVar2;
  (pCVar3->Child).
  super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)&pCVar3->Child;
  (pCVar3->Child).
  super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&pCVar3->Child;
  (pCVar3->Child).
  super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>._M_impl.
  _M_node._M_size = 0;
  pCVar3->_vptr_CX3DImporter_NodeElement = (_func_int **)&PTR__CX3DImporter_NodeElement_008c25b8;
  *(undefined4 *)&pCVar3[1]._vptr_CX3DImporter_NodeElement = 0x3f800000;
  *(undefined8 *)((long)&pCVar3[1]._vptr_CX3DImporter_NodeElement + 4) = 0;
  *(undefined8 *)&pCVar3[1].field_0xc = 0;
  *(undefined4 *)((long)&pCVar3[1].ID._M_dataplus._M_p + 4) = 0x3f800000;
  pCVar3[1].ID._M_string_length = 0;
  pCVar3[1].ID.field_2._M_allocated_capacity = 0;
  *(undefined4 *)((long)&pCVar3[1].ID.field_2 + 8) = 0x3f800000;
  *(undefined8 *)((long)&pCVar3[1].ID.field_2 + 0xc) = 0;
  *(undefined8 *)((long)&pCVar3[1].Parent + 4) = 0;
  *(undefined4 *)
   ((long)&pCVar3[1].Child.
           super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
           ._M_impl._M_node.super__List_node_base._M_next + 4) = 0x3f800000;
  *(bool *)&pCVar3[1].Child.
            super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
            ._M_impl._M_node.super__List_node_base._M_prev = pStatic;
  *(undefined1 *)
   ((long)&pCVar3[1].Child.
           super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
           ._M_impl._M_node.super__List_node_base._M_prev + 1) = 0;
  if (pCVar2 != (CX3DImporter_NodeElement *)0x0) {
    p_Var4 = (_List_node_base *)operator_new(0x18);
    p_Var4[1]._M_next = (_List_node_base *)pCVar3;
    std::__detail::_List_node_base::_M_hook(p_Var4);
    psVar1 = &(pCVar2->Child).
              super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
  }
  p_Var4 = (_List_node_base *)operator_new(0x18);
  p_Var4[1]._M_next = (_List_node_base *)pCVar3;
  std::__detail::_List_node_base::_M_hook(p_Var4);
  psVar1 = &(this->NodeElement_List).
            super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  this->NodeElement_Cur = pCVar3;
  return;
}

Assistant:

void X3DImporter::ParseHelper_Group_Begin(const bool pStatic)
{
    CX3DImporter_NodeElement_Group* new_group = new CX3DImporter_NodeElement_Group(NodeElement_Cur, pStatic);// create new node with current node as parent.

	// if we are adding not the root element then add new element to current element child list.
    if ( NodeElement_Cur != nullptr )
    {
        NodeElement_Cur->Child.push_back( new_group );
    }

	NodeElement_List.push_back(new_group);// it's a new element - add it to list.
	NodeElement_Cur = new_group;// switch current element to new one.
}